

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O3

long __thiscall CVmFileSource::get_size(CVmFileSource *this)

{
  long __off;
  long lVar1;
  
  __off = ftell((FILE *)this->fp);
  fseek((FILE *)this->fp,0,2);
  lVar1 = ftell((FILE *)this->fp);
  fseek((FILE *)this->fp,__off,0);
  return lVar1;
}

Assistant:

virtual long get_size()
    {
        /* remember the current seek location */
        long oldpos = osfpos(fp);

        /* seek to the end */
        osfseek(fp, 0, OSFSK_END);

        /* the current position is the file size */
        long siz = osfpos(fp);

        /* seek back to where we started */
        osfseek(fp, oldpos, OSFSK_SET);

        /* return the size */
        return siz;
    }